

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

Image * vera::denoise(Image *__return_storage_ptr__,Image *_color,Image *_normal,Image *_albedo,
                     bool _hdr)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Hilma was compiled without support for OpenImageDenoise. Please install it on your system and recompile hilma"
             ,0x6d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  Image::Image(__return_storage_ptr__,_color);
  return __return_storage_ptr__;
}

Assistant:

Image   denoise(const Image& _color, const Image& _normal, const Image& _albedo, bool _hdr) {
#ifndef OPENIMAGEDENOISE_SUPPORT
    std::cout << "Hilma was compiled without support for OpenImageDenoise. Please install it on your system and recompile hilma" << std::endl;
    return _color;

#else
    if (_color.getChannels() != 3) {
        std::cout << "input image need to have 3 channels (RGB)" << std::endl;
        return _color;
    }

    Image out = Image(_color);

    // Create an Intel Open Image Denoise device
    oidn::DeviceRef device = oidn::newDevice();
    device.commit();

    // Create a denoising filter
    oidn::FilterRef filter = device.newFilter("RT"); // generic ray tracing filter
    filter.setImage("color", (void*)&_color[0],  oidn::Format::Float3, _color.getWidth(), _color.getHeight());
    filter.setImage("albedo", (void*)&_albedo[0], oidn::Format::Float3, _albedo.getWidth(), _albedo.getHeight()); // optional
    filter.setImage("normal", (void*)&_normal[0], oidn::Format::Float3, _normal.getWidth(), _normal.getHeight()); // optional
    filter.setImage("output", (void*)&out[0], oidn::Format::Float3, out.getWidth(), out.getHeight());
    filter.set("hdr", _hdr); // image is HDR
    filter.commit();

    // Filter the image
    filter.execute();

    // Check for errors
    const char* errorMessage;
    if (device.getError(errorMessage) != oidn::Error::None)
    std::cout << "Error: " << errorMessage << std::endl;

    return out;
#endif
}